

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidgetItem::setData(QTableWidgetItem *this,int role,QVariant *value)

{
  int *piVar1;
  char cVar2;
  QWidgetItemData *pQVar3;
  pointer pQVar4;
  QTableModel *this_00;
  long lVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<int> args;
  size_type sStack_70;
  int local_60 [2];
  undefined1 local_58 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  if (role != 2) {
    iVar6 = role;
  }
  lVar5 = (this->values).d.size + 1;
  lVar7 = 0x20;
  pQVar3 = (this->values).d.ptr;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      local_58._0_4_ = iVar6;
      ::QVariant::QVariant((QVariant *)&aStack_50,value);
      QList<QWidgetItemData>::emplaceBack<QWidgetItemData>
                (&this->values,(QWidgetItemData *)local_58);
      ::QVariant::~QVariant((QVariant *)&aStack_50);
      goto LAB_0053727d;
    }
    lVar7 = lVar7 + -0x28;
    piVar1 = &pQVar3->role;
    pQVar3 = pQVar3 + 1;
  } while (*piVar1 != iVar6);
  pQVar4 = QList<QWidgetItemData>::data(&this->values);
  cVar2 = ::QVariant::equals((QVariant *)((long)pQVar4 - lVar7));
  if (cVar2 == '\0') {
    pQVar4 = QList<QWidgetItemData>::data(&this->values);
    ::QVariant::operator=((QVariant *)((long)pQVar4 - lVar7),value);
LAB_0053727d:
    this_00 = tableModel(this);
    if (this_00 != (QTableModel *)0x0) {
      aStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      aStack_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      if (iVar6 == 0) {
        local_60[0] = 0;
        local_60[1] = 2;
        sStack_70 = 2;
      }
      else {
        local_60[0] = iVar6;
        sStack_70 = 1;
      }
      args._M_array = local_60;
      args._M_len = sStack_70;
      QList<int>::QList((QList<int> *)local_58,args);
      QTableModel::itemChanged(this_00,this,(QList<int> *)local_58);
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < values.size(); ++i) {
        if (values.at(i).role == role) {
            if (values[i].value == value)
                return;

            values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        values.append(QWidgetItemData(role, value));
    if (QTableModel *model = tableModel())
    {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}